

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

VdbeOp * sqlite3VdbeAddOpList(Vdbe *p,int nOp,VdbeOpList *aOp,int iLineno)

{
  Op *pOVar1;
  int iVar2;
  VdbeOp *pFirst;
  VdbeOp *pOut;
  int i;
  int iLineno_local;
  VdbeOpList *aOp_local;
  int nOp_local;
  Vdbe *p_local;
  
  if ((p->nOpAlloc < p->nOp + nOp) && (iVar2 = growOpArray(p,nOp), iVar2 != 0)) {
    return (VdbeOp *)0x0;
  }
  pOVar1 = p->aOp;
  iVar2 = p->nOp;
  pFirst = pOVar1 + iVar2;
  _i = aOp;
  for (pOut._0_4_ = 0; (int)pOut < nOp; pOut._0_4_ = (int)pOut + 1) {
    pFirst->opcode = _i->opcode;
    pFirst->p1 = (int)_i->p1;
    pFirst->p2 = (int)_i->p2;
    if (((""[_i->opcode] & 1) != 0) && ('\0' < _i->p2)) {
      pFirst->p2 = p->nOp + pFirst->p2;
    }
    pFirst->p3 = (int)_i->p3;
    pFirst->p4type = '\0';
    (pFirst->p4).p = (void *)0x0;
    pFirst->p5 = 0;
    _i = _i + 1;
    pFirst = pFirst + 1;
  }
  p->nOp = nOp + p->nOp;
  return pOVar1 + iVar2;
}

Assistant:

SQLITE_PRIVATE VdbeOp *sqlite3VdbeAddOpList(
  Vdbe *p,                     /* Add opcodes to the prepared statement */
  int nOp,                     /* Number of opcodes to add */
  VdbeOpList const *aOp,       /* The opcodes to be added */
  int iLineno                  /* Source-file line number of first opcode */
){
  int i;
  VdbeOp *pOut, *pFirst;
  assert( nOp>0 );
  assert( p->magic==VDBE_MAGIC_INIT );
  if( p->nOp + nOp > p->nOpAlloc && growOpArray(p, nOp) ){
    return 0;
  }
  pFirst = pOut = &p->aOp[p->nOp];
  for(i=0; i<nOp; i++, aOp++, pOut++){
    pOut->opcode = aOp->opcode;
    pOut->p1 = aOp->p1;
    pOut->p2 = aOp->p2;
    assert( aOp->p2>=0 );
    if( (sqlite3OpcodeProperty[aOp->opcode] & OPFLG_JUMP)!=0 && aOp->p2>0 ){
      pOut->p2 += p->nOp;
    }
    pOut->p3 = aOp->p3;
    pOut->p4type = P4_NOTUSED;
    pOut->p4.p = 0;
    pOut->p5 = 0;
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
    pOut->zComment = 0;
#endif
#ifdef SQLITE_VDBE_COVERAGE
    pOut->iSrcLine = iLineno+i;
#else
    (void)iLineno;
#endif
#ifdef SQLITE_DEBUG
    if( p->db->flags & SQLITE_VdbeAddopTrace ){
      sqlite3VdbePrintOp(0, i+p->nOp, &p->aOp[i+p->nOp]);
    }
#endif
  }
  p->nOp += nOp;
  return pFirst;
}